

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool-inl.h
# Opt level: O2

void __thiscall spdlog::details::thread_pool::~thread_pool(thread_pool *this)

{
  pointer ptVar1;
  iterator __begin2;
  pointer ptVar2;
  ulong uVar3;
  async_msg local_1c8;
  
  uVar3 = 0;
  while( true ) {
    ptVar2 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)ptVar1 - (long)ptVar2 >> 3) <= uVar3) break;
    async_msg::async_msg(&local_1c8,terminate);
    mpmc_blocking_queue<spdlog::details::async_msg>::enqueue(&this->q_,&local_1c8);
    async_msg::~async_msg(&local_1c8);
    uVar3 = uVar3 + 1;
  }
  for (; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  mpmc_blocking_queue<spdlog::details::async_msg>::~mpmc_blocking_queue(&this->q_);
  return;
}

Assistant:

SPDLOG_INLINE thread_pool::~thread_pool()
{
    SPDLOG_TRY
    {
        for (size_t i = 0; i < threads_.size(); i++)
        {
            post_async_msg_(async_msg(async_msg_type::terminate), async_overflow_policy::block);
        }

        for (auto &t : threads_)
        {
            t.join();
        }
    }
    SPDLOG_CATCH_ALL() {}
}

void SPDLOG_INLINE thread_pool::post_log(async_logger_ptr &&worker_ptr, const details::log_msg &msg, async_overflow_policy overflow_policy)
{
    async_msg async_m(std::move(worker_ptr), async_msg_type::log, msg);
    post_async_msg_(std::move(async_m), overflow_policy);
}